

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTestListener.cpp
# Opt level: O0

TestListener * rc::detail::globalTestListener(void)

{
  int iVar1;
  Configuration *config;
  type pTVar2;
  
  if (globalTestListener()::listener == '\0') {
    iVar1 = __cxa_guard_acquire(&globalTestListener()::listener);
    if (iVar1 != 0) {
      config = configuration();
      makeDefaultTestListener((detail *)&globalTestListener::listener,config,(ostream *)&std::cerr);
      __cxa_atexit(std::
                   unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>
                   ::~unique_ptr,&globalTestListener::listener,&__dso_handle);
      __cxa_guard_release(&globalTestListener()::listener);
    }
  }
  pTVar2 = std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>
           ::operator*(&globalTestListener::listener);
  return pTVar2;
}

Assistant:

TestListener &globalTestListener() {
  static const auto listener =
      makeDefaultTestListener(configuration(), std::cerr);
  return *listener;
}